

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexStorageVirtualPageSizeIndexError
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  stringstream *log;
  bool bVar1;
  bool bVar2;
  GLenum GVar3;
  GLuint depth;
  GLint numPageSizes;
  GLuint texture;
  
  log = &this->mLog;
  std::operator<<((ostream *)&this->field_0x88,"Verify VirtualPageSizeIndex errors - ");
  gl4cts::Texture::Generate(gl,&texture);
  gl4cts::Texture::Bind(gl,texture,target);
  (*gl->texParameteri)(target,0x91a6,1);
  GVar3 = (*gl->getError)();
  bVar2 = false;
  bVar1 = SparseTextureUtils::verifyQueryError(log,"texParameteri",target,0x91a6,GVar3,0);
  if (bVar1) {
    (*gl->getInternalformativ)(target,format,0x91a8,4,&numPageSizes);
    GVar3 = (*gl->getError)();
    bVar2 = false;
    bVar1 = SparseTextureUtils::verifyQueryError(log,"getInternalformativ",target,0x91a8,GVar3,0);
    if (bVar1) {
      numPageSizes = numPageSizes + 1;
      (*gl->texParameteri)(target,0x91a7,numPageSizes);
      GVar3 = (*gl->getError)();
      bVar2 = false;
      bVar1 = SparseTextureUtils::verifyQueryError(log,"texParameteri",target,0x91a7,GVar3,0);
      if (bVar1) {
        depth = SparseTextureUtils::getTargetDepth(target);
        gl4cts::Texture::Storage(gl,target,1,format,8,8,depth);
        GVar3 = (*gl->getError)();
        bVar2 = SparseTextureUtils::verifyError(log,"TexStorage",GVar3,0);
      }
    }
  }
  gl4cts::Texture::Delete(gl,&texture);
  return bVar2;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexStorageVirtualPageSizeIndexError(const Functions& gl, GLint target,
																				GLint format)
{
	mLog << "Verify VirtualPageSizeIndex errors - ";

	GLuint texture;
	GLint  depth;
	GLint  numPageSizes;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	if (!SparseTextureUtils::verifyQueryError(mLog, "texParameteri", target, GL_TEXTURE_SPARSE_ARB, gl.getError(),
											  GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	gl.getInternalformativ(target, format, GL_NUM_VIRTUAL_PAGE_SIZES_ARB, sizeof(numPageSizes), &numPageSizes);
	if (!SparseTextureUtils::verifyQueryError(mLog, "getInternalformativ", target, GL_NUM_VIRTUAL_PAGE_SIZES_ARB,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	numPageSizes += 1;
	gl.texParameteri(target, GL_VIRTUAL_PAGE_SIZE_INDEX_ARB, numPageSizes);
	if (!SparseTextureUtils::verifyQueryError(mLog, "texParameteri", target, GL_VIRTUAL_PAGE_SIZE_INDEX_ARB,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	depth = SparseTextureUtils::getTargetDepth(target);

	Texture::Storage(gl, target, 1, format, 8, 8, depth);
	if (!SparseTextureUtils::verifyError(mLog, "TexStorage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	Texture::Delete(gl, texture);
	return true;
}